

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

int units::precise::custom::custom_unit_number(unit_data *UT)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int32_t iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int num;
  unit_data *UT_local;
  
  bVar1 = detail::unit_data::has_e_flag(UT);
  bVar2 = detail::unit_data::has_i_flag(UT);
  iVar11 = 0;
  if (bVar2) {
    iVar11 = 2;
  }
  bVar2 = detail::unit_data::is_per_unit(UT);
  iVar12 = 0;
  if (bVar2) {
    iVar12 = 4;
  }
  iVar3 = detail::unit_data::meter(UT);
  lVar13 = (long)iVar3;
  if (lVar13 < 1) {
    lVar13 = -lVar13;
  }
  iVar3 = 0;
  if (lVar13 < 4) {
    iVar3 = 0x100;
  }
  iVar4 = detail::unit_data::second(UT);
  lVar13 = (long)iVar4;
  if (lVar13 < 1) {
    lVar13 = -lVar13;
  }
  iVar4 = 0;
  if (5 < lVar13) {
    iVar4 = 0x200;
  }
  iVar5 = detail::unit_data::kg(UT);
  lVar13 = (long)iVar5;
  if (lVar13 < 1) {
    lVar13 = -lVar13;
  }
  iVar5 = 0;
  if (lVar13 < 2) {
    iVar5 = 0x80;
  }
  iVar6 = detail::unit_data::kelvin(UT);
  lVar13 = (long)iVar6;
  if (lVar13 < 1) {
    lVar13 = -lVar13;
  }
  iVar6 = 0;
  if (lVar13 == 3) {
    iVar6 = 0x10;
  }
  iVar7 = detail::unit_data::ampere(UT);
  iVar8 = detail::maxNeg(3);
  iVar9 = 0;
  if (iVar7 == iVar8) {
    iVar9 = 0x40;
  }
  iVar7 = detail::unit_data::candela(UT);
  lVar13 = (long)iVar7;
  if (lVar13 < 1) {
    lVar13 = -lVar13;
  }
  iVar7 = 0x20;
  if (1 < lVar13) {
    iVar7 = 0;
  }
  iVar10 = detail::unit_data::currency(UT);
  lVar13 = (long)iVar10;
  if (lVar13 < 1) {
    lVar13 = -lVar13;
  }
  iVar10 = 0;
  if (1 < lVar13) {
    iVar10 = 8;
  }
  return iVar10 + iVar7 + iVar9 + iVar6 + iVar5 + iVar4 + iVar3 + (uint)bVar1 + iVar11 + iVar12;
}

Assistant:

inline int custom_unit_number(const detail::unit_data& UT)
        {
            int num = (UT.has_e_flag() ? 1 : 0) + (UT.has_i_flag() ? 2 : 0) +
                (UT.is_per_unit() ? 4 : 0);
            num += (std::labs(UT.meter()) < 4) ? 256 : 0;
            num += (std::labs(UT.second()) >= 6) ? 512 : 0;
            num += (std::labs(UT.kg()) <= 1) ? 128 : 0;
            num += (std::labs(UT.kelvin()) == 3) ? 16 : 0;
            num += (UT.ampere() == detail::maxNeg(detail::bitwidth::ampere)) ?
                64 :
                0;
            num += (std::labs(UT.candela()) >= 2) ? 0 : 32;
            num += (std::labs(UT.currency()) >= 2) ? 8 : 0;
            return num;
        }